

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentsHelper.cxx
# Opt level: O0

bool __thiscall cmCommandArgument::MayFollow(cmCommandArgument *this,cmCommandArgument *current)

{
  bool bVar1;
  _Self local_30;
  _Self local_28;
  const_iterator argIt;
  cmCommandArgument *current_local;
  cmCommandArgument *this_local;
  
  if ((this->ArgumentsBeforeEmpty & 1U) == 0) {
    argIt._M_node = (_Base_ptr)current;
    local_28._M_node =
         (_Base_ptr)
         std::
         set<const_cmCommandArgument_*,_std::less<const_cmCommandArgument_*>,_std::allocator<const_cmCommandArgument_*>_>
         ::find(&this->ArgumentsBefore,(key_type *)&argIt);
    local_30._M_node =
         (_Base_ptr)
         std::
         set<const_cmCommandArgument_*,_std::less<const_cmCommandArgument_*>,_std::allocator<const_cmCommandArgument_*>_>
         ::end(&this->ArgumentsBefore);
    bVar1 = std::operator!=(&local_28,&local_30);
    if (bVar1) {
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool cmCommandArgument::MayFollow(const cmCommandArgument* current) const
{
  if (this->ArgumentsBeforeEmpty)
    {
    return true;
    }

  std::set<const cmCommandArgument*>::const_iterator argIt
                                         = this->ArgumentsBefore.find(current);
  if (argIt != this->ArgumentsBefore.end())
    {
    return true;
    }

  return false;
}